

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O3

optional<slang::TimeScale> __thiscall slang::TimeScale::fromString(TimeScale *this,string_view str)

{
  TimeScaleMagnitude *pTVar1;
  char *pcVar2;
  optional<slang::TimeScaleValue> oVar3;
  optional<slang::TimeScaleValue> oVar4;
  long lVar5;
  byte bVar6;
  undefined8 extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar7;
  bool bVar8;
  string_view str_00;
  string_view str_01;
  TimeScale *local_30;
  
  str_00._M_str = (char *)str._M_len;
  str_00._M_len = (size_t)this;
  oVar3 = parseValue(str_00,(size_t *)&local_30);
  bVar6 = local_30 < this &
          oVar3.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
          super__Optional_payload_base<slang::TimeScaleValue>._M_engaged;
  uVar7 = CONCAT71((int7)((ulong)extraout_RDX >> 8),bVar6);
  if (bVar6 == 1) {
    do {
      if (str_00._M_str[(long)local_30] != ' ') {
        if (str_00._M_str[(long)local_30] == '/') goto LAB_0027d41b;
        break;
      }
      local_30 = (TimeScale *)&(local_30->base).magnitude;
    } while (this != local_30);
  }
  goto LAB_0027d483;
  while (pcVar2 = str_00._M_str + 1 + (long)local_30, local_30 = (TimeScale *)pTVar1, *pcVar2 == ' '
        ) {
LAB_0027d41b:
    pTVar1 = &(local_30->base).magnitude;
    str_01._M_len = (long)this - (long)pTVar1;
    if (this < pTVar1 || str_01._M_len == 0) goto LAB_0027d483;
  }
  str_01._M_str = str_00._M_str + (long)pTVar1;
  oVar4 = parseValue(str_01,(size_t *)&local_30);
  lVar5 = 0;
  uVar7 = extraout_RDX_00;
  if ((((uint3)oVar4.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
               super__Optional_payload_base<slang::TimeScaleValue> >> 0x10 & 1) == 0) ||
     ((undefined1 *)((long)this - (long)local_30) != pTVar1)) goto LAB_0027d485;
  bVar8 = oVar3.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
          super__Optional_payload_base<slang::TimeScaleValue>._M_payload._0_1_ <
          oVar4.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
          super__Optional_payload_base<slang::TimeScaleValue>._M_payload._0_1_;
  if (((oVar3.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
        super__Optional_payload_base<slang::TimeScaleValue>._M_payload._0_1_ ==
        oVar4.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
        super__Optional_payload_base<slang::TimeScaleValue>._M_payload._0_1_) &&
      (bVar8 = oVar4.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
               super__Optional_payload_base<slang::TimeScaleValue>._M_payload._1_1_ <
               oVar3.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
               super__Optional_payload_base<slang::TimeScaleValue>._M_payload._1_1_,
      oVar4.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
      super__Optional_payload_base<slang::TimeScaleValue>._M_payload._1_1_ ==
      oVar3.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
      super__Optional_payload_base<slang::TimeScaleValue>._M_payload._1_1_)) ||
     (uVar7 = (ulong)-(uint)bVar8 | 1, (char)uVar7 < '\x01')) {
    uVar7 = (ulong)((uint3)oVar3.super__Optional_base<slang::TimeScaleValue,_true,_true>._M_payload.
                           super__Optional_payload_base<slang::TimeScaleValue> & 0xffff |
                   (uint)(uint3)oVar4.super__Optional_base<slang::TimeScaleValue,_true,_true>.
                                _M_payload.super__Optional_payload_base<slang::TimeScaleValue> <<
                   0x10);
    lVar5 = 1;
    goto LAB_0027d485;
  }
LAB_0027d483:
  lVar5 = 0;
LAB_0027d485:
  return (_Optional_base<slang::TimeScale,_true,_true>)
         ((uint5)uVar7 & 0xffffffff | (uint5)(lVar5 << 0x20));
}

Assistant:

std::optional<TimeScale> TimeScale::fromString(std::string_view str) {
    size_t idx;
    auto base = parseValue(str, idx);
    if (!base)
        return {};

    while (idx < str.size() && str[idx] == ' ')
        idx++;

    if (idx >= str.size() || str[idx] != '/')
        return {};

    do {
        idx++;
    } while (idx < str.size() && str[idx] == ' ');

    if (idx >= str.size())
        return {};

    str = str.substr(idx);
    auto precision = parseValue(str, idx);
    if (!precision || idx != str.length())
        return {};

    // Precision can't be a larger unit of time than the base.
    if (*precision > *base)
        return {};

    return TimeScale(*base, *precision);
}